

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::ColorConvertHSVtoRGB(float h,float s,float v,float *out_r,float *out_g,float *out_b)

{
  float fVar1;
  float fVar2;
  float fVar3;
  undefined4 extraout_var;
  float fVar4;
  undefined1 extraout_var_00 [12];
  undefined1 auVar5 [16];
  
  if ((s != 0.0) || (NAN(s))) {
    fVar4 = fmodf(h,1.0);
    fVar4 = fVar4 / 0.16666667;
    auVar5._0_4_ = (int)fVar4;
    auVar5._4_4_ = (int)extraout_var_00._0_4_;
    auVar5._8_4_ = (int)extraout_var_00._4_4_;
    auVar5._12_4_ = (int)extraout_var_00._8_4_;
    auVar5 = vcvtdq2ps_avx(auVar5);
    fVar3 = fVar4 - auVar5._0_4_;
    fVar1 = (1.0 - s) * v;
    fVar2 = (1.0 - s * fVar3) * v;
    if ((uint)(int)fVar4 < 5) {
      (*(code *)(&DAT_001d4bb0 + *(int *)(&DAT_001d4bb0 + CONCAT44(extraout_var,(int)fVar4) * 4)))
                (fVar1,fVar2,(1.0 - s * (1.0 - fVar3)) * v);
      return;
    }
    *out_r = v;
    *out_g = fVar1;
    *out_b = fVar2;
  }
  else {
    *out_b = v;
    *out_g = v;
    *out_r = v;
  }
  return;
}

Assistant:

void ImGui::ColorConvertHSVtoRGB(float h, float s, float v, float& out_r, float& out_g, float& out_b)
{
    if (s == 0.0f)
    {
        // gray
        out_r = out_g = out_b = v;
        return;
    }

    h = ImFmod(h, 1.0f) / (60.0f / 360.0f);
    int   i = (int)h;
    float f = h - (float)i;
    float p = v * (1.0f - s);
    float q = v * (1.0f - s * f);
    float t = v * (1.0f - s * (1.0f - f));

    switch (i)
    {
    case 0: out_r = v; out_g = t; out_b = p; break;
    case 1: out_r = q; out_g = v; out_b = p; break;
    case 2: out_r = p; out_g = v; out_b = t; break;
    case 3: out_r = p; out_g = q; out_b = v; break;
    case 4: out_r = t; out_g = p; out_b = v; break;
    case 5: default: out_r = v; out_g = p; out_b = q; break;
    }
}